

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraKateGenerator.cxx
# Opt level: O2

void __thiscall
cmExtraKateGenerator::CreateDummyKateProjectFile(cmExtraKateGenerator *this,cmLocalGenerator *lg)

{
  char *pcVar1;
  ostream *poVar2;
  string *psVar3;
  string filename;
  cmGeneratedFileStream fout;
  char *local_278 [4];
  undefined1 local_258 [584];
  
  pcVar1 = cmLocalGenerator::GetBinaryDirectory(lg);
  std::__cxx11::string::string((string *)local_278,pcVar1,(allocator *)local_258);
  std::__cxx11::string::append((char *)local_278);
  std::__cxx11::string::append((string *)local_278);
  std::__cxx11::string::append((char *)local_278);
  cmGeneratedFileStream::cmGeneratedFileStream
            ((cmGeneratedFileStream *)local_258,local_278[0],false);
  if (((byte)(*(_func_int **)(local_258._0_8_ + -0x18))[(long)(local_258 + 0x20)] & 5) == 0) {
    poVar2 = std::operator<<((ostream *)local_258,"#Generated by ");
    psVar3 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
    poVar2 = std::operator<<(poVar2,(string *)psVar3);
    std::operator<<(poVar2,", do not edit.\n");
  }
  cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_258);
  std::__cxx11::string::~string((string *)local_278);
  return;
}

Assistant:

void
cmExtraKateGenerator::CreateDummyKateProjectFile(
    const cmLocalGenerator* lg) const
{
  std::string filename = lg->GetBinaryDirectory();
  filename += "/";
  filename += this->ProjectName;
  filename += ".kateproject";
  cmGeneratedFileStream fout(filename.c_str());
  if (!fout)
    {
    return;
    }

  fout << "#Generated by " << cmSystemTools::GetCMakeCommand()
       << ", do not edit.\n";
}